

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O2

LY_ERR schema_mount_sprinter_tree_node_override_parent_refs
                 (lysc_node *node,void *plugin_priv,ly_bool *skip,char **UNUSED_flags,
                 char **add_opts)

{
  long lVar1;
  lysc_module *plVar2;
  bool bVar3;
  ulong uVar4;
  lysc_node *plVar5;
  
  lVar1 = *(long *)((long)plugin_priv + 8);
  plVar2 = node->module->compiled;
  *skip = '\x01';
  bVar3 = true;
  for (uVar4 = 0; uVar4 < *(uint *)(lVar1 + 4); uVar4 = uVar4 + 1) {
    if (!bVar3) goto LAB_00196ee8;
    plVar5 = *(lysc_node **)(*(long *)(lVar1 + 8) + uVar4 * 8);
    if (plVar5->module->compiled == plVar2) {
      for (; plVar5 != (lysc_node *)0x0; plVar5 = plVar5->parent) {
        if (plVar5 == node) {
          *skip = '\0';
          bVar3 = false;
          break;
        }
      }
    }
  }
  if (!bVar3) {
LAB_00196ee8:
    if (node->parent == (lysc_node *)0x0) {
      *add_opts = "@";
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
schema_mount_sprinter_tree_node_override_parent_refs(const struct lysc_node *node, const void *plugin_priv,
        ly_bool *skip, const char **UNUSED(flags), const char **add_opts)
{
    uint32_t i;
    const struct ly_set *refs;
    const struct lysc_module *mod;
    struct lysc_node *ref, *iter;

    refs = ((struct sprinter_tree_priv *)plugin_priv)->refs;
    mod = node->module->compiled;

    /* Assume the @p node will be skipped. */
    *skip = 1;
    for (i = 0; (i < refs->count) && *skip; i++) {
        ref = refs->snodes[i];
        if (ref->module->compiled != mod) {
            /* parent-reference points to different module */
            continue;
        }

        for (iter = ref; iter; iter = iter->parent) {
            if (iter == node) {
                /* @p node is not skipped because it is parent-rererence node or his parent */
                *skip = 0;
                break;
            }
        }
    }

    if (!*skip && !node->parent) {
        /* top-node has additional opts */
        *add_opts = "@";
    }

    return LY_SUCCESS;
}